

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::WheelEvent,QWindow*,unsigned_long,QPointF,QPointF,QPoint,QPoint,int,Qt::Orientation,QFlags<Qt::KeyboardModifier>,Qt::ScrollPhase,Qt::MouseEventSource,bool,QPointingDevice_const*>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,QPoint args_4,
               QPoint args_5,int args_6,Orientation args_7,QFlags<Qt::KeyboardModifier> args_8,
               ScrollPhase args_9,MouseEventSource args_10,bool args_11,QPointingDevice *args_12)

{
  long *plVar1;
  bool bVar2;
  WheelEvent *this;
  long in_FS_OFFSET;
  QPointF QStack_58;
  QPointF QStack_48;
  long lVar3;
  
  QStack_48.yp = args_2.yp;
  QStack_48.xp = args_2.xp;
  QStack_58.yp = args_3.yp;
  QStack_58.xp = args_3.xp;
  if (QWindowSystemInterfacePrivate::synchronousWindowSystemEvents) {
    QStack_48.yp = 1.64846435525305e-317;
    bVar2 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
            handleEvent<QWindowSystemInterfacePrivate::WheelEvent,QWindow*,unsigned_long,QPointF,QPointF,QPoint,QPoint,int,Qt::Orientation,QFlags<Qt::KeyboardModifier>,Qt::ScrollPhase,Qt::MouseEventSource,bool,QPointingDevice_const*>
                      (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10,
                       args_11,args_12);
    return bVar2;
  }
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this = (WheelEvent *)operator_new(0x88);
  QWindowSystemInterfacePrivate::WheelEvent::WheelEvent
            (this,args,args_1,&QStack_48,&QStack_58,args_4,args_5,args_6,args_7,
             (KeyboardModifiers)
             args_8.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
             super_QFlagsStorage<Qt::KeyboardModifier>.i,args_9,args_10,args_11,args_12);
  QWindowSystemInterfacePrivate::WindowSystemEventList::append
            (&QWindowSystemInterfacePrivate::windowSystemEventQueue,(WindowSystemEvent *)this);
  if ((QCoreApplication::self != 0) &&
     (plVar1 = *(long **)(*(long *)(*(long *)(QCoreApplication::self + 8) + 0x58) + 0x60),
     plVar1 != (long *)0x0)) {
    (**(code **)(*plVar1 + 0xa0))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::handleEvent(Args ...args)
{
    return QWindowSystemInterfacePrivate::synchronousWindowSystemEvents
        ? QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent<EventType>(args...)
        : QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
}